

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pow.cpp
# Opt level: O1

uint GetNextWorkRequired(CBlockIndex *pindexLast,CBlockHeader *pblock,Params *params)

{
  uint32_t uVar1;
  long lVar2;
  CBlockIndex *pCVar3;
  int height;
  long in_FS_OFFSET;
  arith_uint256 aStack_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (pindexLast == (CBlockIndex *)0x0) {
    __assert_fail("pindexLast != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/pow.cpp"
                  ,0xf,
                  "unsigned int GetNextWorkRequired(const CBlockIndex *, const CBlockHeader *, const Consensus::Params &)"
                 );
  }
  UintToArith256(&aStack_48,&params->powLimit);
  uVar1 = arith_uint256::GetCompact(&aStack_48,false);
  lVar2 = params->nPowTargetTimespan / params->nPowTargetSpacing;
  if (((long)pindexLast->nHeight + 1) % lVar2 == 0) {
    height = (pindexLast->nHeight - (int)lVar2) + 1;
    if (height < 0) {
      __assert_fail("nHeightFirst >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/pow.cpp"
                    ,0x2a,
                    "unsigned int GetNextWorkRequired(const CBlockIndex *, const CBlockHeader *, const Consensus::Params &)"
                   );
    }
    pCVar3 = CBlockIndex::GetAncestor(pindexLast,height);
    if (pCVar3 == (CBlockIndex *)0x0) {
      __assert_fail("pindexFirst",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/pow.cpp"
                    ,0x2c,
                    "unsigned int GetNextWorkRequired(const CBlockIndex *, const CBlockHeader *, const Consensus::Params &)"
                   );
    }
    uVar1 = CalculateNextWorkRequired(pindexLast,(ulong)pCVar3->nTime,params);
  }
  else if (params->fPowAllowMinDifficultyBlocks == true) {
    if ((long)(ulong)pblock->nTime <=
        (long)((ulong)pindexLast->nTime + params->nPowTargetSpacing * 2)) {
      do {
        pCVar3 = pindexLast;
        if ((pCVar3->pprev == (CBlockIndex *)0x0) || ((long)pCVar3->nHeight % lVar2 == 0)) break;
        pindexLast = pCVar3->pprev;
      } while (pCVar3->nBits == uVar1);
      uVar1 = pCVar3->nBits;
    }
  }
  else {
    uVar1 = pindexLast->nBits;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return uVar1;
  }
  __stack_chk_fail();
}

Assistant:

unsigned int GetNextWorkRequired(const CBlockIndex* pindexLast, const CBlockHeader *pblock, const Consensus::Params& params)
{
    assert(pindexLast != nullptr);
    unsigned int nProofOfWorkLimit = UintToArith256(params.powLimit).GetCompact();

    // Only change once per difficulty adjustment interval
    if ((pindexLast->nHeight+1) % params.DifficultyAdjustmentInterval() != 0)
    {
        if (params.fPowAllowMinDifficultyBlocks)
        {
            // Special difficulty rule for testnet:
            // If the new block's timestamp is more than 2* 10 minutes
            // then allow mining of a min-difficulty block.
            if (pblock->GetBlockTime() > pindexLast->GetBlockTime() + params.nPowTargetSpacing*2)
                return nProofOfWorkLimit;
            else
            {
                // Return the last non-special-min-difficulty-rules-block
                const CBlockIndex* pindex = pindexLast;
                while (pindex->pprev && pindex->nHeight % params.DifficultyAdjustmentInterval() != 0 && pindex->nBits == nProofOfWorkLimit)
                    pindex = pindex->pprev;
                return pindex->nBits;
            }
        }
        return pindexLast->nBits;
    }

    // Go back by what we want to be 14 days worth of blocks
    int nHeightFirst = pindexLast->nHeight - (params.DifficultyAdjustmentInterval()-1);
    assert(nHeightFirst >= 0);
    const CBlockIndex* pindexFirst = pindexLast->GetAncestor(nHeightFirst);
    assert(pindexFirst);

    return CalculateNextWorkRequired(pindexLast, pindexFirst->GetBlockTime(), params);
}